

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::DescriptorBuilder::AddError
          (DescriptorBuilder *this,string *element_name,Message *descriptor,ErrorLocation location,
          char *error)

{
  allocator local_51;
  string local_50;
  char *local_30;
  char *error_local;
  Message *pMStack_20;
  ErrorLocation location_local;
  Message *descriptor_local;
  string *element_name_local;
  DescriptorBuilder *this_local;
  
  local_30 = error;
  error_local._4_4_ = location;
  pMStack_20 = descriptor;
  descriptor_local = (Message *)element_name;
  element_name_local = (string *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_50,error,&local_51);
  AddError(this,element_name,descriptor,location,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return;
}

Assistant:

void DescriptorBuilder::AddError(
    const std::string& element_name, const Message& descriptor,
    DescriptorPool::ErrorCollector::ErrorLocation location, const char* error) {
  AddError(element_name, descriptor, location, std::string(error));
}